

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O1

void __thiscall Tree::createWeightArray(Tree *this)

{
  Node **ppNVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int currWeight;
  int local_24;
  
  uVar7 = 0;
  quickSort(this,0,this->m_queueIndexArraySize + -1);
  iVar4 = this->m_queueIndexArraySize;
  if (0 < iVar4) {
    do {
      local_24 = 1;
      if ((uVar7 != iVar4 - 1U) &&
         (ppNVar1 = this->m_queueIndexArray,
         (ppNVar1[(int)uVar7]->field_1).data.year ==
         (ppNVar1[(long)(int)uVar7 + 1]->field_1).data.year)) {
        uVar5 = (ulong)(int)(uVar7 + 1);
        local_24 = ~uVar7 + iVar4;
        lVar6 = 0;
        do {
          if (~uVar5 + (long)iVar4 == lVar6) goto LAB_00104256;
          lVar2 = uVar5 + lVar6;
          lVar3 = lVar6 + 1;
          lVar6 = lVar6 + 1;
        } while ((ppNVar1[lVar2]->field_1).data.year == (ppNVar1[uVar5 + lVar3]->field_1).data.year)
        ;
        local_24 = (int)lVar6;
LAB_00104256:
        local_24 = local_24 + 1;
      }
      __position._M_current =
           (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_weightArray,__position,&local_24);
      }
      else {
        *__position._M_current = local_24;
        (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar7 = uVar7 + local_24;
      iVar4 = this->m_queueIndexArraySize;
    } while ((int)uVar7 < iVar4);
  }
  return;
}

Assistant:

void createWeightArray() {
        quickSort(0, m_queueIndexArraySize - 1);
        int currWeight = 1;
        for (int i = 0; i < m_queueIndexArraySize; ++i) {
            if ((i != m_queueIndexArraySize - 1) && (m_queueIndexArray[i]->data.year == m_queueIndexArray[i + 1]->data.year)) {
                currWeight++;
                int j = i + 1;
                while ((j != m_queueIndexArraySize - 1) && (m_queueIndexArray[j]->data.year == m_queueIndexArray[j + 1]->data.year)) {
                    currWeight++;
                    j++;
                }
            }
            m_weightArray.push_back(currWeight);
            i += currWeight - 1;
            currWeight = 1;
        }
    }